

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void slang::ast::PortConnection::makeConnections
               (InstanceSymbol *instance,
               span<const_slang::ast::Symbol_*const,_18446744073709551615UL> ports,
               SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections,
               SmallVector<const_slang::ast::PortConnection_*,_5UL> *results)

{
  bool bVar1;
  reference ppSVar2;
  PortConnection *conn_2;
  InterfacePortSymbol *port_2;
  PortConnection *conn_1;
  MultiPortSymbol *port_1;
  PortConnection *conn;
  PortSymbol *port;
  Symbol *portBase;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range2;
  PortConnectionBuilder builder;
  PortConnection *in_stack_fffffffffffffd18;
  PortConnectionBuilder *in_stack_fffffffffffffd20;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *in_stack_fffffffffffffd28;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *in_stack_fffffffffffffd80;
  InstanceSymbol *in_stack_fffffffffffffd88;
  PortConnectionBuilder *in_stack_fffffffffffffd90;
  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_268;
  undefined1 *local_260;
  PortConnectionBuilder *in_stack_fffffffffffffdf0;
  PortSymbol *in_stack_fffffffffffffeb0;
  PortConnectionBuilder *in_stack_fffffffffffffeb8;
  InterfacePortSymbol *in_stack_fffffffffffffec0;
  PortConnectionBuilder *in_stack_fffffffffffffec8;
  undefined1 local_10 [16];
  
  anon_unknown_0::PortConnectionBuilder::PortConnectionBuilder
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  local_260 = local_10;
  local_268._M_current =
       (Symbol **)
       std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffd18);
  std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end(in_stack_fffffffffffffd28)
  ;
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffd20,
                            (__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffd18), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppSVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_268);
    if ((*ppSVar2)->kind == Port) {
      Symbol::as<slang::ast::PortSymbol>((Symbol *)0x46b1a9);
      anon_unknown_0::PortConnectionBuilder::getConnection<slang::ast::PortSymbol>
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      SmallVectorBase<const_slang::ast::PortConnection_*>::push_back
                ((SmallVectorBase<const_slang::ast::PortConnection_*> *)in_stack_fffffffffffffd20,
                 (PortConnection **)in_stack_fffffffffffffd18);
    }
    else if ((*ppSVar2)->kind == MultiPort) {
      Symbol::as<slang::ast::MultiPortSymbol>((Symbol *)0x46b22e);
      anon_unknown_0::PortConnectionBuilder::getConnection<slang::ast::MultiPortSymbol>
                (in_stack_fffffffffffffeb8,(MultiPortSymbol *)in_stack_fffffffffffffeb0);
      SmallVectorBase<const_slang::ast::PortConnection_*>::push_back
                ((SmallVectorBase<const_slang::ast::PortConnection_*> *)in_stack_fffffffffffffd20,
                 (PortConnection **)in_stack_fffffffffffffd18);
    }
    else {
      in_stack_fffffffffffffd20 =
           (PortConnectionBuilder *)Symbol::as<slang::ast::InterfacePortSymbol>((Symbol *)0x46b286);
      in_stack_fffffffffffffd18 =
           anon_unknown_0::PortConnectionBuilder::getIfaceConnection
                     (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      SmallVectorBase<const_slang::ast::PortConnection_*>::push_back
                ((SmallVectorBase<const_slang::ast::PortConnection_*> *)in_stack_fffffffffffffd20,
                 (PortConnection **)in_stack_fffffffffffffd18);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_268);
  }
  anon_unknown_0::PortConnectionBuilder::finalize(in_stack_fffffffffffffdf0);
  anon_unknown_0::PortConnectionBuilder::~PortConnectionBuilder(in_stack_fffffffffffffd20);
  return;
}

Assistant:

void PortConnection::makeConnections(
    const InstanceSymbol& instance, std::span<const Symbol* const> ports,
    const SeparatedSyntaxList<PortConnectionSyntax>& portConnections,
    SmallVector<const PortConnection*>& results) {

    PortConnectionBuilder builder(instance, portConnections);
    for (auto portBase : ports) {
        if (portBase->kind == SymbolKind::Port) {
            auto& port = portBase->as<PortSymbol>();
            auto conn = builder.getConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
        else if (portBase->kind == SymbolKind::MultiPort) {
            auto& port = portBase->as<MultiPortSymbol>();
            auto conn = builder.getConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
        else {
            auto& port = portBase->as<InterfacePortSymbol>();
            auto conn = builder.getIfaceConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
    }

    builder.finalize();
}